

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_b53b8e::StoreResult<cmValue>
               (OutType infoType,cmMakefile *makefile,string *variable,cmValue value)

{
  bool bVar1;
  char *local_58;
  string_view local_38;
  string *local_28;
  string *variable_local;
  cmMakefile *makefile_local;
  cmValue cStack_10;
  OutType infoType_local;
  cmValue value_local;
  
  local_28 = variable;
  variable_local = (string *)makefile;
  makefile_local._4_4_ = infoType;
  cStack_10.Value = value.Value;
  if (infoType == OutSet) {
    bVar1 = cmValue::operator_cast_to_bool(&stack0xfffffffffffffff0);
    if (bVar1) {
      local_58 = "1";
    }
    else {
      local_58 = "0";
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,local_58);
    cmMakefile::AddDefinition(makefile,variable,local_38);
  }
  else {
    bVar1 = cmValue::operator_cast_to_bool(&stack0xfffffffffffffff0);
    if (bVar1) {
      cmMakefile::AddDefinition((cmMakefile *)variable_local,local_28,cStack_10);
    }
    else {
      cmMakefile::RemoveDefinition((cmMakefile *)variable_local,local_28);
    }
  }
  return true;
}

Assistant:

bool StoreResult(OutType infoType, cmMakefile& makefile,
                 const std::string& variable, ValueType value)
{
  if (infoType == OutSet) {
    makefile.AddDefinition(variable, value ? "1" : "0");
  } else // if(infoType == OutValue)
  {
    if (value) {
      makefile.AddDefinition(variable, value);
    } else {
      makefile.RemoveDefinition(variable);
    }
  }
  return true;
}